

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qorderedmutexlocker_p.h
# Opt level: O3

bool QOrderedMutexLocker::relock(QBasicMutex *mtx1,QBasicMutex *mtx2)

{
  __pointer_type pQVar1;
  QBasicMutex *this;
  bool bVar2;
  
  if (mtx1 == mtx2) goto LAB_002b8c3e;
  pQVar1 = (mtx2->d_ptr)._q_value._M_b._M_p;
  if (mtx1 < mtx2) {
    this = mtx2;
    if (pQVar1 == (__pointer_type)0x0) {
      LOCK();
      bVar2 = (mtx2->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar2) {
        (mtx2->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
joined_r0x002b8c37:
      if (bVar2) goto LAB_002b8c3e;
    }
  }
  else {
    if (pQVar1 == (__pointer_type)0x0) {
      LOCK();
      bVar2 = (mtx2->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar2) {
        (mtx2->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar2) goto LAB_002b8c3e;
    }
    LOCK();
    pQVar1 = (mtx1->d_ptr)._q_value._M_b._M_p;
    (mtx1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (pQVar1 != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(mtx1,pQVar1);
    }
    if ((mtx2->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      bVar2 = (mtx2->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar2) {
        (mtx2->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (!bVar2) goto LAB_002b8c15;
    }
    else {
LAB_002b8c15:
      QBasicMutex::lockInternal(mtx2);
    }
    this = mtx1;
    if ((mtx1->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      bVar2 = (mtx1->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar2) {
        (mtx1->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      goto joined_r0x002b8c37;
    }
  }
  QBasicMutex::lockInternal(this);
LAB_002b8c3e:
  return mtx1 != mtx2;
}

Assistant:

static bool relock(QBasicMutex *mtx1, QBasicMutex *mtx2)
    {
        // mtx1 is already locked, mtx2 not... do we need to unlock and relock?
        if (mtx1 == mtx2)
            return false;
        if (std::less<QBasicMutex *>()(mtx1, mtx2)) {
            mtx2->lock();
            return true;
        }
        if (!mtx2->tryLock()) {
            mtx1->unlock();
            mtx2->lock();
            mtx1->lock();
        }
        return true;
    }